

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
booster::locale::basic_format<wchar_t>::write
          (basic_format<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  int id;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ios_base local_60 [8];
  string_type local_58;
  undefined1 local_38 [8];
  string_type format;
  stream_type *out_local;
  basic_format<wchar_t> *this_local;
  
  format.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::wstring::wstring((wstring *)local_38);
  if ((this->translate_ & 1U) == 0) {
    std::__cxx11::wstring::operator=((wstring *)local_38,(wstring *)&this->format_);
  }
  else {
    std::ios_base::getloc(local_60);
    booster::locale::ios_info::get
              ((ios_base *)(format.field_2._8_8_ + *(long *)(*(long *)format.field_2._8_8_ + -0x18))
              );
    id = booster::locale::ios_info::domain_id();
    basic_message<wchar_t>::str_abi_cxx11_(&local_58,&this->message_,(locale *)local_60,id);
    std::__cxx11::wstring::operator=((wstring *)local_38,(wstring *)&local_58);
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
    std::locale::~locale((locale *)local_60);
  }
  format_output(this,(stream_type *)format.field_2._8_8_,(string_type *)local_38);
  sVar1 = std::__cxx11::wstring::~wstring((wstring *)local_38);
  return sVar1;
}

Assistant:

void write(stream_type &out) const
            {
                string_type format;
                if(translate_)
                    format = message_.str(out.getloc(),ios_info::get(out).domain_id());
                else
                    format = format_;
               
                format_output(out,format);

            }